

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.c
# Opt level: O2

curl_version_info_data * curl_version_info(CURLversion stamp)

{
  char *pcVar1;
  int iVar2;
  nghttp2_info *pnVar3;
  long lVar4;
  uint uVar5;
  int *piVar6;
  
  Curl_ssl_version(curl_version_info::ssl_buffer,0x50);
  version_info.ssl_version = curl_version_info::ssl_buffer;
  version_info.libz_version = cm_zlib_zlibVersion();
  uVar5 = 0;
  pnVar3 = nghttp2_version(0);
  version_info.nghttp2_ver_num = pnVar3->version_num;
  version_info.nghttp2_version = pnVar3->version_str;
  piVar6 = &features_table[0].bitmask;
  lVar4 = 0;
  do {
    pcVar1 = ((feat *)(piVar6 + -4))->name;
    if (pcVar1 == (char *)0x0) {
      feature_names[lVar4] = (char *)0x0;
      version_info.features = uVar5;
      return &version_info;
    }
    if (*(_func_int_curl_version_info_data_ptr **)(piVar6 + -2) ==
        (_func_int_curl_version_info_data_ptr *)0x0) {
LAB_0055c73b:
      uVar5 = uVar5 | *piVar6;
      feature_names[lVar4] = pcVar1;
      lVar4 = lVar4 + 1;
    }
    else {
      iVar2 = (**(_func_int_curl_version_info_data_ptr **)(piVar6 + -2))(&version_info);
      if (iVar2 != 0) goto LAB_0055c73b;
    }
    piVar6 = piVar6 + 6;
  } while( true );
}

Assistant:

curl_version_info_data *curl_version_info(CURLversion stamp)
{
  size_t n;
  const struct feat *p;
  int features = 0;

#if defined(USE_SSH)
  static char ssh_buffer[80];
#endif
#ifdef USE_SSL
#ifdef CURL_WITH_MULTI_SSL
  static char ssl_buffer[200];
#else
  static char ssl_buffer[80];
#endif
#endif
#ifdef HAVE_BROTLI
  static char brotli_buffer[80];
#endif
#ifdef HAVE_ZSTD
  static char zstd_buffer[80];
#endif

  (void)stamp; /* avoid compiler warnings, we don't use this */

#ifdef USE_SSL
  Curl_ssl_version(ssl_buffer, sizeof(ssl_buffer));
  version_info.ssl_version = ssl_buffer;
#endif

#ifdef HAVE_LIBZ
  version_info.libz_version = zlibVersion();
  /* libz left NULL if non-existing */
#endif
#ifdef USE_ARES
  {
    int aresnum;
    version_info.ares = ares_version(&aresnum);
    version_info.ares_num = aresnum;
  }
#endif
#ifdef USE_LIBIDN2
  /* This returns a version string if we use the given version or later,
     otherwise it returns NULL */
  version_info.libidn = idn2_check_version(IDN2_VERSION);
#endif

#if defined(USE_SSH)
  Curl_ssh_version(ssh_buffer, sizeof(ssh_buffer));
  version_info.libssh_version = ssh_buffer;
#endif

#ifdef HAVE_BROTLI
  version_info.brotli_ver_num = BrotliDecoderVersion();
  brotli_version(brotli_buffer, sizeof(brotli_buffer));
  version_info.brotli_version = brotli_buffer;
#endif

#ifdef HAVE_ZSTD
  version_info.zstd_ver_num = (unsigned int)ZSTD_versionNumber();
  zstd_version(zstd_buffer, sizeof(zstd_buffer));
  version_info.zstd_version = zstd_buffer;
#endif

#ifdef USE_NGHTTP2
  {
    nghttp2_info *h2 = nghttp2_version(0);
    version_info.nghttp2_ver_num = h2->version_num;
    version_info.nghttp2_version = h2->version_str;
  }
#endif

#ifdef ENABLE_QUIC
  {
    static char quicbuffer[80];
    Curl_quic_ver(quicbuffer, sizeof(quicbuffer));
    version_info.quic_version = quicbuffer;
  }
#endif

#ifdef USE_HYPER
  {
    static char hyper_buffer[30];
    msnprintf(hyper_buffer, sizeof(hyper_buffer), "Hyper/%s", hyper_version());
    version_info.hyper_version = hyper_buffer;
  }
#endif

#ifdef USE_GSASL
  {
    version_info.gsasl_version = gsasl_check_version(NULL);
  }
#endif

  /* Get available features, build bitmask and names array. */
  n = 0;
  for(p = features_table; p->name; p++)
    if(!p->present || p->present(&version_info)) {
      features |= p->bitmask;
      feature_names[n++] = p->name;
    }

  feature_names[n] = NULL;  /* Terminate array. */
  version_info.features = features;

  return &version_info;
}